

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

GLuint __thiscall
glcts::anon_unknown_0::DrawIndirectBase::CreateComputeProgram
          (DrawIndirectBase *this,string *cs,bool linkAndCheck)

{
  GLuint program;
  GLuint shader;
  CallLogWrapper *this_00;
  char *src [1];
  pointer local_28;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  local_28 = (cs->_M_dataplus)._M_p;
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_28,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  return program;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs, bool linkAndCheck)
	{
		const GLuint p = glCreateProgram();

		const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
		glAttachShader(p, sh);
		glDeleteShader(sh);
		const char* const src[1] = { cs.c_str() };
		glShaderSource(sh, 1, src, NULL);
		glCompileShader(sh);

		if (linkAndCheck)
		{
			glLinkProgram(p);
			if (!CheckProgram(p))
			{
				return 0;
			}
		}

		return p;
	}